

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImFont::ImFont(ImFont *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  
  (this->IndexLookup).Size = 0;
  (this->IndexLookup).Capacity = 0;
  (this->IndexLookup).Data = (unsigned_short *)0x0;
  (this->Glyphs).Size = 0;
  (this->Glyphs).Capacity = 0;
  (this->Glyphs).Data = (ImFontGlyph *)0x0;
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  (this->DisplayOffset).x = 0.0;
  (this->DisplayOffset).y = 0.0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->ConfigData = (ImFontConfig *)0x0;
  auVar2 = ZEXT432(0) << 0x40;
  auVar1 = auVar2._0_16_;
  (this->IndexAdvanceX).Size = auVar1._0_4_;
  (this->IndexAdvanceX).Capacity = auVar1._4_4_;
  (this->IndexAdvanceX).Data = (float *)auVar1._8_8_;
  this->FallbackAdvanceX = (float)auVar2._16_4_;
  this->FontSize = (float)auVar2._20_4_;
  (this->IndexLookup).Size = auVar2._24_4_;
  (this->IndexLookup).Capacity = auVar2._28_4_;
  this->EllipsisChar = 0xffff;
  this->DirtyLookupTables = false;
  this->ConfigDataCount = 0;
  this->FallbackChar = 0x3f;
  this->Scale = 1.0;
  this->Ascent = 0.0;
  this->Descent = 0.0;
  *(undefined8 *)((long)&this->Descent + 2) = 0;
  return;
}

Assistant:

inline ImVector()                                       { Size = Capacity = 0; Data = NULL; }